

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvex2dConvex2dAlgorithm.h
# Opt level: O3

btCollisionAlgorithm * __thiscall
btConvex2dConvex2dAlgorithm::CreateFunc::CreateCollisionAlgorithm
          (CreateFunc *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap)

{
  btPersistentManifold *pbVar1;
  btConvexPenetrationDepthSolver *pbVar2;
  btVoronoiSimplexSolver *pbVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  btCollisionAlgorithm *this_00;
  
  iVar4 = (*ci->m_dispatcher1->_vptr_btDispatcher[0xe])(ci->m_dispatcher1,0x38);
  this_00 = (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar4);
  pbVar1 = ci->m_manifold;
  pbVar2 = this->m_pdSolver;
  pbVar3 = this->m_simplexSolver;
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            ((btActivatingCollisionAlgorithm *)this_00,ci,body0Wrap,body1Wrap);
  ((btCollisionAlgorithm *)&this_00->_vptr_btCollisionAlgorithm)->_vptr_btCollisionAlgorithm =
       (_func_int **)&PTR__btConvex2dConvex2dAlgorithm_0021c578;
  local_48 = SUB84(pbVar2,0);
  uStack_44 = (undefined4)((ulong)pbVar2 >> 0x20);
  uStack_40 = SUB84(pbVar3,0);
  *(undefined4 *)
   &((btCollisionAlgorithm *)&this_00[1]._vptr_btCollisionAlgorithm)->_vptr_btCollisionAlgorithm =
       uStack_40;
  *(undefined4 *)
   ((long)&((btCollisionAlgorithm *)&this_00[1]._vptr_btCollisionAlgorithm)->
           _vptr_btCollisionAlgorithm + 4) = uStack_44;
  *(undefined4 *)&this_00[1].m_dispatcher = local_48;
  *(undefined4 *)((long)&this_00[1].m_dispatcher + 4) = uStack_44;
  *(undefined1 *)
   &((btCollisionAlgorithm *)&this_00[2]._vptr_btCollisionAlgorithm)->_vptr_btCollisionAlgorithm = 0
  ;
  this_00[2].m_dispatcher = (btDispatcher *)pbVar1;
  *(undefined1 *)
   &((btCollisionAlgorithm *)&this_00[3]._vptr_btCollisionAlgorithm)->_vptr_btCollisionAlgorithm = 0
  ;
  return this_00;
}

Assistant:

virtual	btCollisionAlgorithm* CreateCollisionAlgorithm(btCollisionAlgorithmConstructionInfo& ci, const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
		{
			void* mem = ci.m_dispatcher1->allocateCollisionAlgorithm(sizeof(btConvex2dConvex2dAlgorithm));
			return new(mem) btConvex2dConvex2dAlgorithm(ci.m_manifold,ci,body0Wrap,body1Wrap,m_simplexSolver,m_pdSolver,m_numPerturbationIterations,m_minimumPointsPerturbationThreshold);
		}